

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O3

char * memdup(char *src,size_t buffer_length)

{
  size_t __n;
  char *pcVar1;
  
  __n = buffer_length;
  if (buffer_length == 0) {
    if (src == (char *)0x0) {
      pcVar1 = (*Curl_cstrdup)("");
      return pcVar1;
    }
    __n = strlen(src);
  }
  pcVar1 = (char *)(*Curl_cmalloc)(__n + (buffer_length == 0));
  if (pcVar1 == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    memcpy(pcVar1,src,__n);
    if (buffer_length == 0) {
      pcVar1[__n] = '\0';
    }
  }
  return pcVar1;
}

Assistant:

static char *memdup(const char *src, size_t buffer_length)
{
  size_t length;
  bool add = FALSE;
  char *buffer;

  if(buffer_length)
    length = buffer_length;
  else if(src) {
    length = strlen(src);
    add = TRUE;
  }
  else
    /* no length and a NULL src pointer! */
    return strdup("");

  buffer = malloc(length+add);
  if(!buffer)
    return NULL; /* fail */

  memcpy(buffer, src, length);

  /* if length unknown do null termination */
  if(add)
    buffer[length] = '\0';

  return buffer;
}